

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

void __thiscall
dg::vr::RelationsAnalyzer::inferFromNonEquality
          (RelationsAnalyzer *this,VRLocation *join,VectorSet<const_llvm::Value_*> *froms,Shift s,
          Handle placeholder)

{
  ValueRelations *this_00;
  bool *pbVar1;
  Instruction *ptr;
  ValueRelations *pVVar2;
  V pVVar3;
  bool bVar4;
  bool bVar5;
  Type TVar6;
  VRLocation *pVVar7;
  HandlePtr pBVar8;
  Argument *pAVar9;
  Function *f;
  VectorSet<const_llvm::Value_*> *pVVar10;
  Relations RVar11;
  vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *pvVar12;
  size_t id;
  Bucket *lt;
  pointer pBVar13;
  V val;
  pointer ppIVar14;
  uint uVar15;
  bool *pbVar16;
  pointer ppVVar17;
  pair<const_llvm::Value_*,_bool> pVar18;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar19;
  V compared;
  Argument *arg;
  V local_d0;
  Type local_c4;
  Argument *local_c0;
  ValueRelations *local_b8;
  RelationsAnalyzer *local_b0;
  VRLocation *local_a8;
  Handle local_a0;
  Type local_94;
  bool *local_90;
  ValueRelations *local_88;
  Bucket *local_80;
  pointer local_78;
  pointer local_70;
  long local_68;
  V local_60;
  pointer local_58;
  key_type local_50;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> local_48;
  
  local_a8 = join;
  local_a0 = placeholder;
  pVVar7 = VRLocation::getTreePredecessor(join);
  ppVVar17 = (froms->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_78 = (froms->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppVVar17 != local_78) {
    local_b8 = &pVVar7->relations;
    local_c4 = (uint)(s != INC) * 4 + SLE;
    local_68 = 1L << (sbyte)local_c4;
    local_88 = &local_a8->relations;
    local_94 = (uint)(s != INC) * 4 + SLT;
    local_90 = &(local_a8->relations).changed;
    local_b0 = this;
    do {
      val = *ppVVar17;
      pBVar8 = ValueRelations::maybeGet(local_b8,val);
      local_80 = ((pBVar8->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_data;
      getEQICmp(&local_48,this,local_a8);
      local_58 = local_48.
                 super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppIVar14 = local_48.
                 super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVVar3 = val;
      if (local_48.
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_48.
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        bVar4 = false;
      }
      else {
        do {
          local_60 = pVVar3;
          local_70 = ppVVar17;
          ptr = (Instruction *)*ppIVar14;
          pVVar7 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),ptr);
          pVar18 = getCompared(&pVVar7->relations,(ICmpInst *)ptr,val);
          local_d0 = pVar18.first;
          uVar15 = 5;
          if (local_d0 != (Value *)0x0) {
            if (0x13 < (byte)local_d0[0x10]) {
              pVVar7 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),ptr);
              pAVar9 = ValueRelations::getInstance<llvm::Argument>(&pVVar7->relations,local_d0);
              if (pAVar9 == (Argument *)0x0) goto LAB_0011ff3a;
            }
            local_c0 = getArgument(local_b8,local_80);
            if (local_c0 == (Argument *)0x0) {
              uVar15 = 5;
              val = local_60;
              this = local_b0;
            }
            else {
              f = (Function *)llvm::Instruction::getFunction();
              pVVar7 = VRCodeGraph::getEntryLocation(*(VRCodeGraph **)(this + 0x38),f);
              this_00 = &pVVar7->relations;
              if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                bVar4 = StructureAnalyzer::hasBorderValues(*(StructureAnalyzer **)(this + 0x40),f);
                if (bVar4) {
                  pvVar12 = StructureAnalyzer::getBorderValuesFor
                                      (*(StructureAnalyzer **)(local_b0 + 0x40),f);
                  pVVar2 = local_88;
                  uVar15 = 6;
                  for (pBVar13 = (pvVar12->
                                 super__Vector_base<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                      bVar4 = pBVar13 !=
                              (pvVar12->
                              super__Vector_base<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>
                              )._M_impl.super__Vector_impl_data._M_finish, bVar4;
                      pBVar13 = pBVar13 + 1) {
                    if ((pBVar13->from == local_c0) && (pBVar13->stored == local_d0)) {
                      pBVar8 = ValueRelations::getBorderH(local_88,pBVar13->id);
                      bVar5 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                                        (&pVVar2->graph,local_a0,local_c4,pBVar8,(Relations *)0x0);
                      pbVar1 = &(local_a8->relations).changed;
                      *pbVar1 = (bool)(*pbVar1 | bVar5);
                      uVar15 = 1;
                      break;
                    }
                  }
                  val = local_60;
                  this = local_b0;
                  if (bVar4) goto LAB_0011ff3a;
                }
                id = StructureAnalyzer::addBorderValue
                               (*(StructureAnalyzer **)(local_b0 + 0x40),f,local_c0,local_d0);
                lt = RelationsGraph<dg::vr::ValueRelations>::getBorderBucket(&this_00->graph,id);
                local_50._M_data = lt;
                std::
                map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
                ::operator[](&(pVVar7->relations).bucketToVals,&local_50);
                pVar19 = ValueRelations::get(this_00,local_d0);
                bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                                  (&this_00->graph,lt,PT,pVar19.first._M_data._M_data,
                                   (Relations *)0x0);
                pbVar16 = &(pVVar7->relations).changed;
                pbVar1 = &(pVVar7->relations).changed;
                *pbVar1 = (bool)(*pbVar1 | bVar4);
                TVar6 = dg::vr::Relations::inverted(local_c4);
                pVar19 = ValueRelations::get(this_00,(V)local_c0);
                bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                                  (&this_00->graph,lt,TVar6,pVar19.first._M_data._M_data,
                                   (Relations *)0x0);
              }
              else {
                pVVar10 = ValueRelations::getEqual(local_b8,local_80);
                pVVar2 = local_88;
                RVar11 = ValueRelations::_between
                                   (local_88,*(pVVar10->vec).
                                              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start,local_d0);
                TVar6 = local_c4;
                if (((uint)local_68 & (uint)RVar11.bits.super__Base_bitset<1UL>._M_w) == 0) {
                  StructureAnalyzer::addPrecondition
                            (*(StructureAnalyzer **)(local_b0 + 0x40),f,local_c0,local_c4,local_d0);
                  ValueRelations::set<llvm::Argument_const*,llvm::Value_const*>
                            (this_00,&local_c0,TVar6,&local_d0);
                }
                RVar11 = ValueRelations::_between(pVVar2,(V)local_c0,local_d0);
                pVar19 = ValueRelations::get(pVVar2,local_d0);
                TVar6 = local_94;
                if (((ulong)RVar11.bits.super__Base_bitset<1UL>._M_w & 2) == 0) {
                  TVar6 = local_c4;
                }
                bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                                  (&pVVar2->graph,local_a0,TVar6,pVar19.first._M_data._M_data,
                                   (Relations *)0x0);
                pbVar16 = local_90;
              }
              *pbVar16 = (bool)(*pbVar16 | bVar4);
              uVar15 = 0;
              val = local_60;
              this = local_b0;
            }
          }
LAB_0011ff3a:
          ppVVar17 = local_70;
          if ((uVar15 != 5) && (uVar15 != 0)) goto LAB_0011ff5d;
          ppIVar14 = ppIVar14 + 1;
          pVVar3 = local_60;
        } while (ppIVar14 != local_58);
        uVar15 = 0;
LAB_0011ff5d:
        bVar4 = (uVar15 & 3) != 0;
      }
      if (local_48.
          super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppVVar17 = ppVVar17 + 1;
    } while (!(bool)(bVar4 | ppVVar17 == local_78));
  }
  return;
}

Assistant:

void RelationsAnalyzer::inferFromNonEquality(VRLocation &join,
                                             const VectorSet<V> &froms, Shift s,
                                             Handle placeholder) {
    const ValueRelations &predGraph = join.getTreePredecessor().relations;
    for (V from : froms) {
        Handle initH = predGraph.getPointedTo(from);
        for (const auto *icmp : getEQICmp(join)) {
            V compared;
            bool direct;
            std::tie(compared, direct) = getCompared(
                    codeGraph.getVRLocation(icmp).relations, icmp, from);
            if (!compared ||
                (!llvm::isa<llvm::Constant>(compared) &&
                 !codeGraph.getVRLocation(icmp)
                          .relations.getInstance<llvm::Argument>(compared)))
                continue;

            const llvm::Argument *arg = getArgument(predGraph, initH);
            if (!arg)
                continue;

            const llvm::Function *func = icmp->getFunction();

            ValueRelations &entryRels =
                    codeGraph.getEntryLocation(*func).relations;
            if (direct) {
                if (!join.relations.are(*predGraph.getEqual(initH).begin(),
                                        s == Shift::INC ? Relations::SLE
                                                        : Relations::SGE,
                                        compared)) {
                    structure.addPrecondition(func, arg,
                                              s == Shift::INC ? Relations::SLE
                                                              : Relations::SGE,
                                              compared);
                    entryRels.set(arg,
                                  s == Shift::INC ? Relations::SLE
                                                  : Relations::SGE,
                                  compared);
                }

                if (join.relations.are(arg, Relations::NE, compared))
                    join.relations.set(placeholder,
                                       s == Shift::INC ? Relations::SLT
                                                       : Relations::SGT,
                                       compared);
                else
                    join.relations.set(placeholder,
                                       s == Shift::INC ? Relations::SLE
                                                       : Relations::SGE,
                                       compared);
            } else {
                if (structure.hasBorderValues(func)) {
                    for (const auto &borderVal :
                         structure.getBorderValuesFor(func)) {
                        if (borderVal.from == arg &&
                            borderVal.stored == compared) {
                            auto thisBorderPlaceholder =
                                    join.relations.getBorderH(borderVal.id);
                            assert(thisBorderPlaceholder);
                            join.relations.set(placeholder,
                                               s == Shift::INC ? Relations::SLE
                                                               : Relations::SGE,
                                               *thisBorderPlaceholder);
                            return;
                        }
                    }
                }

                auto id = structure.addBorderValue(func, arg, compared);
                Handle entryBorderPlaceholder = entryRels.newBorderBucket(id);
                entryRels.set(entryBorderPlaceholder, Relations::PT, compared);
                entryRels.set(entryBorderPlaceholder,
                              Relations::inverted(s == Shift::INC
                                                          ? Relations::SLE
                                                          : Relations::SGE),
                              arg);
            }
        }
    }
}